

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O0

void mserialize::detail::visit_arithmetic<mserialize::detail::IntegerToHex,InputStream>
               (char tag,IntegerToHex *visitor,InputStream *istream)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  IntegerToHex *in_RSI;
  undefined1 in_DIL;
  longdouble D;
  double d;
  float f;
  uint64_t L;
  uint32_t I;
  uint16_t S;
  uint8_t B;
  int64_t l;
  int32_t i;
  int16_t s;
  int8_t b;
  char c;
  bool y;
  undefined4 in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff1c;
  undefined1 in_stack_ffffffffffffff1e;
  uchar in_stack_ffffffffffffff1f;
  undefined2 in_stack_ffffffffffffff20;
  undefined5 in_stack_ffffffffffffff22;
  char in_stack_ffffffffffffff27;
  allocator local_a9;
  string local_a8 [32];
  string local_88 [32];
  longdouble local_68;
  double local_50;
  float local_44;
  IntegerToHex *local_10;
  
  local_10 = in_RSI;
  switch(in_DIL) {
  case 0x42:
    deserialize<unsigned_char,InputStream>
              ((uchar *)CONCAT17(in_stack_ffffffffffffff27,
                                 CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (InputStream *)
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,
                                 CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))));
    IntegerToHex::visit<unsigned_char>
              ((IntegerToHex *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               in_stack_ffffffffffffff1f);
    break;
  default:
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"Invalid arithmetic tag: ",&local_a9);
    std::operator+(__lhs,in_stack_ffffffffffffff27);
    std::runtime_error::runtime_error((runtime_error *)__lhs,local_88);
    __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 0x44:
    deserialize<long_double,InputStream>
              ((longdouble *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (InputStream *)
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,
                                 CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))));
    IntegerToHex::visit<long_double>(local_10,local_68);
    break;
  case 0x49:
    deserialize<unsigned_int,InputStream>
              ((uint *)CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (InputStream *)
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,
                                 CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))));
    IntegerToHex::visit<unsigned_int>
              ((IntegerToHex *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               CONCAT13(in_stack_ffffffffffffff1f,
                        CONCAT12(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1c)));
    break;
  case 0x4c:
    deserialize<unsigned_long,InputStream>
              ((unsigned_long *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (InputStream *)
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,
                                 CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))));
    IntegerToHex::visit<unsigned_long>
              ((IntegerToHex *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,
                                 CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))));
    break;
  case 0x53:
    deserialize<unsigned_short,InputStream>
              ((unsigned_short *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (InputStream *)
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,
                                 CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))));
    IntegerToHex::visit<unsigned_short>
              ((IntegerToHex *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               CONCAT11(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff1e));
    break;
  case 0x62:
    deserialize<signed_char,InputStream>
              ((char *)CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (InputStream *)
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,
                                 CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))));
    IntegerToHex::visit<signed_char>
              ((IntegerToHex *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               in_stack_ffffffffffffff1f);
    break;
  case 99:
    deserialize<char,InputStream>
              ((char *)CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (InputStream *)
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,
                                 CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))));
    IntegerToHex::visit<char>
              ((IntegerToHex *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               in_stack_ffffffffffffff1f);
    break;
  case 100:
    deserialize<double,InputStream>
              ((double *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (InputStream *)
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,
                                 CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))));
    IntegerToHex::visit<double>(local_10,local_50);
    break;
  case 0x66:
    deserialize<float,InputStream>
              ((float *)CONCAT17(in_stack_ffffffffffffff27,
                                 CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (InputStream *)
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,
                                 CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))));
    IntegerToHex::visit<float>(local_10,local_44);
    break;
  case 0x69:
    deserialize<int,InputStream>
              ((int *)CONCAT17(in_stack_ffffffffffffff27,
                               CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (InputStream *)
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,
                                 CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))));
    IntegerToHex::visit<int>
              ((IntegerToHex *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               CONCAT13(in_stack_ffffffffffffff1f,
                        CONCAT12(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1c)));
    break;
  case 0x6c:
    deserialize<long,InputStream>
              ((long *)CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (InputStream *)
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,
                                 CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))));
    IntegerToHex::visit<long>
              ((IntegerToHex *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,
                                 CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))));
    break;
  case 0x73:
    deserialize<short,InputStream>
              ((short *)CONCAT17(in_stack_ffffffffffffff27,
                                 CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (InputStream *)
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,
                                 CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))));
    IntegerToHex::visit<short>
              ((IntegerToHex *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               CONCAT11(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff1e));
    break;
  case 0x79:
    deserialize<bool,InputStream>
              ((bool *)CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (InputStream *)
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,
                                 CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))));
    IntegerToHex::visit<bool>
              ((IntegerToHex *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT52(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20)),
               (bool)in_stack_ffffffffffffff1f);
  }
  return;
}

Assistant:

void visit_arithmetic(char tag, Visitor& visitor, InputStream& istream)
{
  switch(tag)
  {
  case 'y': bool y; mserialize::deserialize(y, istream); visitor.visit(y); break;
  case 'c': char c; mserialize::deserialize(c, istream); visitor.visit(c); break;

  case 'b': std::int8_t  b; mserialize::deserialize(b, istream); visitor.visit(b); break;
  case 's': std::int16_t s; mserialize::deserialize(s, istream); visitor.visit(s); break;
  case 'i': std::int32_t i; mserialize::deserialize(i, istream); visitor.visit(i); break;
  case 'l': std::int64_t l; mserialize::deserialize(l, istream); visitor.visit(l); break;

  case 'B': std::uint8_t  B; mserialize::deserialize(B, istream); visitor.visit(B); break;
  case 'S': std::uint16_t S; mserialize::deserialize(S, istream); visitor.visit(S); break;
  case 'I': std::uint32_t I; mserialize::deserialize(I, istream); visitor.visit(I); break;
  case 'L': std::uint64_t L; mserialize::deserialize(L, istream); visitor.visit(L); break;

  case 'f': float f;       mserialize::deserialize(f, istream); visitor.visit(f); break;
  case 'd': double d;      mserialize::deserialize(d, istream); visitor.visit(d); break;
  case 'D': long double D; mserialize::deserialize(D, istream); visitor.visit(D); break;
  default: throw std::runtime_error(std::string("Invalid arithmetic tag: ") + tag); break;
  }
}